

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

ON_Brep * __thiscall ON_BrepRegion::RegionBoundaryBrep(ON_BrepRegion *this,ON_Brep *brep)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_Brep *this_00;
  ON_BrepFaceSide **ppOVar4;
  int *subfi_00;
  bool local_9a;
  bool local_99;
  bool bHasBoundary;
  ON_BrepFace *pOStack_98;
  bool bIsOriented;
  ON_BrepFace *face;
  ON_BrepFaceSide *fs;
  int i;
  int rfsi;
  ON_SimpleArray<int> subfi;
  ON_SimpleArray<const_ON_BrepFaceSide_*> FS;
  ON_Brep *rtop_brep;
  undefined1 local_30 [8];
  ON_Workspace ws;
  ON_Brep *brep_local;
  ON_BrepRegion *this_local;
  
  ws.m_pMemBlk = (ON_Workspace_MBLK *)brep;
  ON_Workspace::ON_Workspace((ON_Workspace *)local_30);
  if (this->m_rtop == (ON_BrepRegionTopology *)0x0) {
    this_local = (ON_BrepRegion *)0x0;
  }
  else {
    this_00 = ON_BrepRegionTopology::Brep(this->m_rtop);
    if ((((this_00 == (ON_Brep *)ws.m_pMemBlk) || (this_00 == (ON_Brep *)0x0)) ||
        (iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this_00->m_F),
        iVar2 < 1)) || (iVar2 = ON_SimpleArray<int>::Count(&this->m_fsi), iVar2 < 1)) {
      this_local = (ON_BrepRegion *)0x0;
    }
    else {
      iVar2 = ON_SimpleArray<int>::Count(&this->m_fsi);
      ON_SimpleArray<const_ON_BrepFaceSide_*>::ON_SimpleArray
                ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count,(long)iVar2);
      iVar2 = ON_SimpleArray<int>::Count(&this->m_fsi);
      ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&i,(long)iVar2);
      for (fs._4_4_ = 0; iVar2 = fs._4_4_, iVar3 = ON_SimpleArray<int>::Count(&this->m_fsi),
          iVar2 < iVar3; fs._4_4_ = fs._4_4_ + 1) {
        face = (ON_BrepFace *)FaceSide(this,fs._4_4_);
        if (((face == (ON_BrepFace *)0x0) || ((face->m_face_user).i < 0)) ||
           (iVar2 = (face->m_face_user).i,
           iVar3 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this_00->m_F),
           iVar3 <= iVar2)) {
          this_local = (ON_BrepRegion *)0x0;
          goto LAB_005669e2;
        }
        fs._0_4_ = 0;
        while ((iVar2 = (int)fs,
               iVar3 = ON_SimpleArray<const_ON_BrepFaceSide_*>::Count
                                 ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count),
               iVar2 < iVar3 &&
               (iVar2 = (face->m_face_user).i,
               ppOVar4 = ON_SimpleArray<const_ON_BrepFaceSide_*>::operator[]
                                   ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count,
                                    (int)fs), iVar2 != (*ppOVar4)->m_fi))) {
          fs._0_4_ = (int)fs + 1;
        }
        iVar2 = (int)fs;
        iVar3 = ON_SimpleArray<const_ON_BrepFaceSide_*>::Count
                          ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count);
        if (iVar3 <= iVar2) {
          ON_SimpleArray<const_ON_BrepFaceSide_*>::Append
                    ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count,
                     (ON_BrepFaceSide **)&face);
          ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&i,(face->m_face_user).j);
        }
      }
      iVar2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&i);
      subfi_00 = ON_SimpleArray<int>::Array((ON_SimpleArray<int> *)&i);
      ws.m_pMemBlk = (ON_Workspace_MBLK *)
                     ON_Brep::SubBrep(this_00,iVar2,subfi_00,(ON_Brep *)ws.m_pMemBlk);
      if ((ON_Brep *)ws.m_pMemBlk == (ON_Brep *)0x0) {
        this_local = (ON_BrepRegion *)0x0;
      }
      else {
        iVar2 = ON_ClassArray<ON_BrepFace>::Count
                          ((ON_ClassArray<ON_BrepFace> *)&((ON_Brep *)ws.m_pMemBlk)->m_F);
        iVar3 = ON_SimpleArray<const_ON_BrepFaceSide_*>::Count
                          ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count);
        if (iVar2 == iVar3) {
          for (fs._0_4_ = 0; iVar2 = (int)fs,
              iVar3 = ON_SimpleArray<const_ON_BrepFaceSide_*>::Count
                                ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count),
              iVar2 < iVar3; fs._0_4_ = (int)fs + 1) {
            pOStack_98 = ON_ClassArray<ON_BrepFace>::operator[]
                                   ((ON_ClassArray<ON_BrepFace> *)(ws.m_pMemBlk + 0xc),(int)fs);
            ppOVar4 = ON_SimpleArray<const_ON_BrepFaceSide_*>::operator[]
                                ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count,(int)fs);
            pOStack_98->m_bRev = (*ppOVar4)->m_srf_dir < 0;
          }
          local_99 = false;
          local_9a = true;
          bVar1 = ON_Brep::IsManifold((ON_Brep *)ws.m_pMemBlk,&local_99,&local_9a);
          if (((bVar1) && ((local_99 & 1U) != 0)) && ((local_9a & 1U) == 0)) {
            if (this->m_type == 1) {
              *(undefined4 *)&ws.m_pMemBlk[0x13].pNext = 2;
            }
            else if (this->m_type == 0) {
              *(undefined4 *)&ws.m_pMemBlk[0x13].pNext = 1;
            }
          }
          this_local = (ON_BrepRegion *)ws.m_pMemBlk;
        }
        else {
          this_local = (ON_BrepRegion *)0x0;
        }
      }
LAB_005669e2:
      ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&i);
      ON_SimpleArray<const_ON_BrepFaceSide_*>::~ON_SimpleArray
                ((ON_SimpleArray<const_ON_BrepFaceSide_*> *)&subfi.m_count);
    }
  }
  ON_Workspace::~ON_Workspace((ON_Workspace *)local_30);
  return (ON_Brep *)this_local;
}

Assistant:

ON_Brep* ON_BrepRegion::RegionBoundaryBrep( ON_Brep* brep ) const
{
  ON_Workspace ws;
  if ( 0 == m_rtop )
    return 0;

  const ON_Brep* rtop_brep = m_rtop->Brep();

  if ( rtop_brep == brep || 0 == rtop_brep || rtop_brep->m_F.Count() <= 0 || m_fsi.Count() <= 0 )
    return 0;

  ON_SimpleArray<const ON_BrepFaceSide*> FS(m_fsi.Count());
  ON_SimpleArray<int> subfi(m_fsi.Count());

  int rfsi, i;
  for ( rfsi = 0; rfsi < m_fsi.Count(); rfsi++ )
  {
    const ON_BrepFaceSide* fs = FaceSide(rfsi);
    if ( 0 == fs || fs->m_fi < 0 || fs->m_fi >= rtop_brep->m_F.Count() )
      return 0;
    for ( i = 0; i < FS.Count(); i++ )
    {
      if ( fs->m_fi == FS[i]->m_fi )
        break;
    }
    if ( i < FS.Count() )
      continue;
    FS.Append(fs);
    subfi.Append(fs->m_fi);
  }

  brep = rtop_brep->SubBrep(subfi.Count(),subfi.Array(),brep);
  if ( !brep )
    return 0;
  if ( brep->m_F.Count() != FS.Count() )
    return 0;
  for ( i = 0; i < FS.Count(); i++ )
  {
    ON_BrepFace& face = brep->m_F[i];
    face.m_bRev = ( FS[i]->m_srf_dir < 0 );
  }

  bool bIsOriented = false;
  bool bHasBoundary = true;
  if ( brep->IsManifold(&bIsOriented,&bHasBoundary) )
  {
    if ( bIsOriented && !bHasBoundary )
    {
      if ( 1 == m_type )
        brep->m_is_solid = 2;
      else if ( 0 == m_type )
        brep->m_is_solid = 1;
    }
  }

  return brep;
}